

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  _Rb_tree_node_base *p_Var1;
  FILE *__stream;
  bool bVar2;
  size_type sVar3;
  Message *pMVar4;
  _Rb_tree_node_base *p_Var5;
  char *pcVar6;
  int line_00;
  char *names;
  char *pcVar7;
  Message errors;
  String name;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  TypedTestCasePState *local_a8;
  uint local_9c;
  String local_98;
  internal *local_88;
  string local_80;
  _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  local_60;
  
  *this = (TypedTestCasePState)0x1;
  pcVar7 = registered_tests + -1;
  local_a8 = this;
  local_9c = line;
  local_88 = (internal *)file;
  do {
    pcVar6 = pcVar7 + 1;
    pcVar7 = pcVar7 + 1;
    bVar2 = IsSpace(*pcVar6);
  } while (bVar2);
  Message::Message((Message *)&local_b0);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = (_Rb_tree_node_base *)(local_a8 + 0x10);
  pcVar6 = pcVar7;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pcVar6 == (char *)0x0) {
      for (p_Var5 = *(_Rb_tree_node_base **)(local_a8 + 0x20); line_00 = (int)registered_tests,
          p_Var5 != p_Var1; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        String::String((String *)&local_80,*(char **)(p_Var5 + 1));
        sVar3 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                         *)&local_60,(key_type *)&local_80);
        String::~String((String *)&local_80);
        if (sVar3 == 0) {
          pMVar4 = Message::operator<<((Message *)&local_b0,
                                       (char (*) [25])"You forgot to list test ");
          pMVar4 = Message::operator<<(pMVar4,(char **)(p_Var5 + 1));
          Message::operator<<(pMVar4,(char (*) [3])0x17991a);
        }
      }
      StringStreamToString((internal *)&local_98,local_b0.ptr_);
      bVar2 = String::operator!=(&local_98,"");
      __stream = _stderr;
      if (!bVar2) {
        String::~String(&local_98);
        std::
        _Rb_tree<testing::internal::String,_testing::internal::String,_std::_Identity<testing::internal::String>,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
        ::~_Rb_tree(&local_60);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_b0);
        return pcVar7;
      }
      FormatFileLocation_abi_cxx11_(&local_80,local_88,(char *)(ulong)local_9c,line_00);
      fprintf(__stream,"%s %s",local_80._M_dataplus._M_p,local_98.c_str_);
      std::__cxx11::string::~string((string *)&local_80);
      fflush(_stderr);
      abort();
    }
    GetPrefixUntilComma((internal *)&local_80,pcVar6);
    sVar3 = std::
            set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
            ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                     *)&local_60,(key_type *)&local_80);
    if (sVar3 == 0) {
      for (p_Var5 = *(_Rb_tree_node_base **)(local_a8 + 0x20); p_Var5 != p_Var1;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        bVar2 = String::operator==((String *)&local_80,*(char **)(p_Var5 + 1));
        if (bVar2) {
          std::
          _Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
          ::_M_insert_unique<testing::internal::String_const&>
                    ((_Rb_tree<testing::internal::String,testing::internal::String,std::_Identity<testing::internal::String>,std::less<testing::internal::String>,std::allocator<testing::internal::String>>
                      *)&local_60,(String *)&local_80);
          goto LAB_0016bc1c;
        }
      }
      pMVar4 = Message::operator<<((Message *)&local_b0,(char (*) [15])"No test named ");
      pMVar4 = Message::operator<<(pMVar4,(String *)&local_80);
      Message::operator<<(pMVar4,(char (*) [34])" can be found in this test case.\n");
    }
    else {
      pMVar4 = Message::operator<<((Message *)&local_b0,(char (*) [6])"Test ");
      pMVar4 = Message::operator<<(pMVar4,(String *)&local_80);
      Message::operator<<(pMVar4,(char (*) [28])" is listed more than once.\n");
    }
LAB_0016bc1c:
    String::~String((String *)&local_80);
    pcVar6 = SkipComma(pcVar6);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}